

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::FastWriter::writeValue(FastWriter *this,Value *value)

{
  bool bVar1;
  ValueType VVar2;
  ArrayIndex AVar3;
  Json *pJVar4;
  Value *pVVar5;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  bool value_00;
  undefined1 extraout_DL_02;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  char *pcVar6;
  double value_01;
  string local_128;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  reference local_100;
  string *name;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  iterator it;
  Members members;
  int index;
  int size;
  string local_a8;
  string local_88;
  string local_68;
  string local_38;
  Value *local_18;
  Value *value_local;
  FastWriter *this_local;
  
  local_18 = value;
  value_local = (Value *)this;
  VVar2 = Value::type(value);
  switch(VVar2) {
  case nullValue:
    std::__cxx11::string::operator+=((string *)&this->document_,"null");
    break;
  case intValue:
    pJVar4 = (Json *)Value::asLargestInt(local_18);
    valueToString_abi_cxx11_(&local_38,pJVar4,CONCAT71(extraout_var,extraout_DL));
    std::__cxx11::string::operator+=((string *)&this->document_,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    break;
  case uintValue:
    pJVar4 = (Json *)Value::asLargestUInt(local_18);
    valueToString_abi_cxx11_(&local_68,pJVar4,CONCAT71(extraout_var_00,extraout_DL_00));
    std::__cxx11::string::operator+=((string *)&this->document_,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    break;
  case realValue:
    value_01 = Value::asDouble(local_18);
    valueToString_abi_cxx11_(&local_88,(Json *)value,value_01);
    std::__cxx11::string::operator+=((string *)&this->document_,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    break;
  case stringValue:
    pJVar4 = (Json *)Value::asCString(local_18);
    valueToQuotedString_abi_cxx11_
              (&local_a8,pJVar4,(char *)CONCAT71(extraout_var_01,extraout_DL_01));
    std::__cxx11::string::operator+=((string *)&this->document_,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    break;
  case booleanValue:
    bVar1 = Value::asBool(local_18);
    valueToString_abi_cxx11_((string *)&index,(Json *)(ulong)bVar1,value_00);
    std::__cxx11::string::operator+=((string *)&this->document_,(string *)&index);
    std::__cxx11::string::~string((string *)&index);
    break;
  case arrayValue:
    std::__cxx11::string::operator+=((string *)&this->document_,"[");
    AVar3 = Value::size(local_18);
    for (members.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (int)members.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage < (int)AVar3;
        members.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)members.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      if (0 < (int)members.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::__cxx11::string::operator+=((string *)&this->document_,",");
      }
      pVVar5 = Value::operator[](local_18,(int)members.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      writeValue(this,pVVar5);
    }
    std::__cxx11::string::operator+=((string *)&this->document_,"]");
    break;
  case objectValue:
    Value::getMemberNames_abi_cxx11_((Members *)&it,local_18);
    std::__cxx11::string::operator+=((string *)&this->document_,"{");
    local_f0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&it);
    while( true ) {
      name = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&it);
      bVar1 = __gnu_cxx::operator!=
                        (&local_f0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&name);
      if (!bVar1) break;
      local_100 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_f0);
      local_108._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&it);
      bVar1 = __gnu_cxx::operator!=(&local_f0,&local_108);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)&this->document_,",");
      }
      pJVar4 = (Json *)std::__cxx11::string::c_str();
      valueToQuotedString_abi_cxx11_
                (&local_128,pJVar4,(char *)CONCAT71(extraout_var_02,extraout_DL_02));
      std::__cxx11::string::operator+=((string *)&this->document_,(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      pcVar6 = ":";
      if ((this->yamlCompatiblityEnabled_ & 1U) != 0) {
        pcVar6 = ": ";
      }
      std::__cxx11::string::operator+=((string *)&this->document_,pcVar6);
      pVVar5 = Value::operator[](local_18,local_100);
      writeValue(this,pVVar5);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_f0);
    }
    std::__cxx11::string::operator+=((string *)&this->document_,"}");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&it);
  }
  return;
}

Assistant:

void 
FastWriter::writeValue( const Value &value )
{
   switch ( value.type() )
   {
   case nullValue:
      document_ += "null";
      break;
   case intValue:
      document_ += valueToString( value.asLargestInt() );
      break;
   case uintValue:
      document_ += valueToString( value.asLargestUInt() );
      break;
   case realValue:
      document_ += valueToString( value.asDouble() );
      break;
   case stringValue:
      document_ += valueToQuotedString( value.asCString() );
      break;
   case booleanValue:
      document_ += valueToString( value.asBool() );
      break;
   case arrayValue:
      {
         document_ += "[";
         int size = value.size();
         for ( int index =0; index < size; ++index )
         {
            if ( index > 0 )
               document_ += ",";
            writeValue( value[index] );
         }
         document_ += "]";
      }
      break;
   case objectValue:
      {
         Value::Members members( value.getMemberNames() );
         document_ += "{";
         for ( Value::Members::iterator it = members.begin(); 
               it != members.end(); 
               ++it )
         {
            const std::string &name = *it;
            if ( it != members.begin() )
               document_ += ",";
            document_ += valueToQuotedString( name.c_str() );
            document_ += yamlCompatiblityEnabled_ ? ": " 
                                                  : ":";
            writeValue( value[name] );
         }
         document_ += "}";
      }
      break;
   }
}